

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O3

void __thiscall
t_perl_generator::generate_service_interface(t_perl_generator *this,t_service *tservice)

{
  int *piVar1;
  ofstream_with_content_based_conditional_update *poVar2;
  t_service *ptVar3;
  t_function *tfunction;
  int iVar4;
  long *plVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  long *plVar7;
  size_type *psVar8;
  t_perl_generator *this_00;
  char *__end;
  pointer *ppptVar9;
  string extends_if;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_f0;
  char *local_d0;
  long local_c8;
  char local_c0 [16];
  vector<t_function_*,_std::allocator<t_function_*>_> local_b0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  string local_70;
  string local_50;
  
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
  ptVar3 = tservice->extends_;
  if (ptVar3 != (t_service *)0x0) {
    perl_namespace_abi_cxx11_(&local_50,this,(ptVar3->super_t_type).program_);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x3a030a);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_80 = *plVar7;
      uStack_78 = (undefined4)plVar5[3];
      uStack_74 = *(undefined4 *)((long)plVar5 + 0x1c);
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar7;
      local_90 = (long *)*plVar5;
    }
    local_88 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    iVar4 = (*(ptVar3->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar3);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,*(ulong *)CONCAT44(extraout_var,iVar4));
    ppptVar9 = &local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    plVar7 = plVar5 + 2;
    if ((pointer *)*plVar5 == (pointer *)plVar7) {
      local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar7;
      lStack_98 = plVar5[3];
      local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppptVar9;
    }
    else {
      local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar7;
      local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*plVar5;
    }
    local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_f0.field_2._M_allocated_capacity = *psVar8;
      local_f0.field_2._8_8_ = plVar5[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar8;
      local_f0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppptVar9) {
      operator_delete(local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  poVar2 = &this->f_service_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"package ",8);
  perl_namespace_abi_cxx11_(&local_f0,this,(this->super_t_oop_generator).super_t_generator.program_)
  ;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar2,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(this->super_t_oop_generator).super_t_generator.service_name_.
                             _M_dataplus._M_p,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"If;",3);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"use strict;",0xb);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,local_c8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_b0,&tservice->functions_);
  if (local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppptVar9 = (pointer *)
               local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"sub ",4);
      tfunction = (t_function *)*ppptVar9;
      this_00 = (t_perl_generator *)0x378967;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
      function_signature(&local_f0,this_00,tfunction,&local_70);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar2,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"  die \'implement interface\';\n}",0x1e);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      ppptVar9 = ppptVar9 + 1;
    } while ((pointer)ppptVar9 !=
             local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  if (local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  return;
}

Assistant:

void t_perl_generator::generate_service_interface(t_service* tservice) {
  string extends_if = "";
  t_service* extends_s = tservice->get_extends();
  if (extends_s != nullptr) {
    extends_if = "use base qw(" + perl_namespace(extends_s->get_program()) + extends_s->get_name()
                 + "If);";
  }

  f_service_ << "package " << perl_namespace(program_) << service_name_ << "If;" << endl << endl
             << "use strict;" << endl << extends_if << endl << endl;

  indent_up();
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_service_ << "sub " << function_signature(*f_iter) << endl << "  die 'implement interface';\n}"
               << endl << endl;
  }
  indent_down();
}